

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamAttribute::QXmlStreamAttribute
          (QXmlStreamAttribute *this,QString *qualifiedName,QString *value)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_value).m_string.ptr = (char16_t *)0x0;
  (this->m_value).m_string.size = 0;
  (this->m_qualifiedName).m_string.size = 0;
  (this->m_value).m_string.d = (Data *)0x0;
  (this->m_qualifiedName).m_string.d = (Data *)0x0;
  (this->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
  (this->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
  (this->m_namespaceUri).m_string.size = 0;
  (this->m_name).m_string.size = 0;
  (this->m_namespaceUri).m_string.d = (Data *)0x0;
  (this->m_name).m_string.d = (Data *)0x0;
  (this->m_name).m_string.ptr = (char16_t *)0x0;
  qVar3 = QString::indexOf(qualifiedName,(QChar)0x3a,0,CaseSensitive);
  QString::mid((QString *)&local_48,qualifiedName,qVar3 + 1,-1);
  pDVar1 = (this->m_name).m_string.d;
  pcVar2 = (this->m_name).m_string.ptr;
  (this->m_name).m_string.d = local_48.d;
  (this->m_name).m_string.ptr = local_48.ptr;
  qVar3 = (this->m_name).m_string.size;
  (this->m_name).m_string.size = local_48.size;
  local_48.d = pDVar1;
  local_48.ptr = pcVar2;
  local_48.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::operator=(&(this->m_qualifiedName).m_string,&qualifiedName->d);
  QArrayDataPointer<char16_t>::operator=(&(this->m_value).m_string,&value->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamAttribute::QXmlStreamAttribute(const QString &qualifiedName, const QString &value)
{
    qsizetype colon = qualifiedName.indexOf(u':');
    m_name = qualifiedName.mid(colon + 1);
    m_qualifiedName = qualifiedName;
    m_value = value;
}